

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O0

void __thiscall cppurses::Text_display::append(Text_display *this,Glyph_string *text)

{
  Attribute attr;
  bool bVar1;
  reference pGVar2;
  const_iterator pvVar3;
  Attribute a;
  const_iterator __end2;
  const_iterator __begin2;
  array<cppurses::Attribute,_8UL> *__range2;
  Glyph *glyph;
  iterator __end1;
  iterator __begin1;
  Glyph_string *__range1;
  Glyph_string *text_local;
  Text_display *this_local;
  
  __end1 = std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::begin
                     (&text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>);
  glyph = (Glyph *)std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>::end
                             (&text->super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>
                             );
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
                                     *)&glyph), bVar1) {
    pGVar2 = __gnu_cxx::
             __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
             ::operator*(&__end1);
    __end2 = std::array<cppurses::Attribute,_8UL>::begin
                       ((array<cppurses::Attribute,_8UL> *)&Attribute_list);
    pvVar3 = std::array<cppurses::Attribute,_8UL>::end
                       ((array<cppurses::Attribute,_8UL> *)&Attribute_list);
    for (; __end2 != pvVar3; __end2 = __end2 + 1) {
      attr = *__end2;
      bVar1 = Brush::has_attribute(&this->insert_brush,attr);
      if (bVar1) {
        Brush::add_attributes<cppurses::Attribute>(&pGVar2->brush,attr);
      }
    }
    __gnu_cxx::
    __normal_iterator<cppurses::Glyph_*,_std::vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>_>
    ::operator++(&__end1);
  }
  Glyph_string::append<>(&this->contents_,text);
  (*(this->super_Widget)._vptr_Widget[3])();
  sig::
  Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
  ::operator()((Signal<void(cppurses::Glyph_string_const&),sig::Optional_last_value<void>,int,std::less<int>,std::function<void(cppurses::Glyph_string_const&)>,std::mutex>
                *)&this->contents_modified,&this->contents_);
  return;
}

Assistant:

void Text_display::append(Glyph_string text) {
    for (auto& glyph : text) {
        for (Attribute a : Attribute_list) {
            if (this->insert_brush.has_attribute(a)) {
                glyph.brush.add_attributes(a);
            }
        }
    }
    contents_.append(text);
    this->update();
    contents_modified(contents_);
}